

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O3

bool __thiscall CGI::check_first_line(CGI *this,CharContent *first_line,Response *response)

{
  size_t sVar1;
  pointer this_00;
  size_t sVar2;
  bool bVar3;
  vector<CharContent,_std::allocator<CharContent>_> local_a8;
  CharContent local_90;
  vector<CharContent,_std::allocator<CharContent>_> local_68;
  vector<CharContent,_std::allocator<CharContent>_> local_48;
  
  local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CharContent::CharContent(&local_90," ");
  CharContent::split(&local_68,first_line,&local_90);
  local_48.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_48);
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_68);
  local_90._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  if (local_90.m != (char *)0x0) {
    operator_delete__(local_90.m);
  }
  this_00 = local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (2 < (ulong)(((long)local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    CharContent::CharContent(&local_90,"HTTP");
    sVar2 = CharContent::find(this_00,&local_90,0);
    sVar1 = (local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
             super__Vector_impl_data._M_start)->npos;
    local_90._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    if (local_90.m != (char *)0x0) {
      operator_delete__(local_90.m);
    }
    if (sVar2 != sVar1) {
      CharContent::operator=
                (&response->protocol,
                 local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                 super__Vector_impl_data._M_start);
      bVar3 = true;
      CharContent::operator=
                (&response->code,
                 local_a8.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                 super__Vector_impl_data._M_start + 1);
      goto LAB_0010a072;
    }
  }
  bVar3 = false;
LAB_0010a072:
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_a8);
  return bVar3;
}

Assistant:

bool CGI::check_first_line(CharContent first_line,Response *response){
	std::vector<CharContent> string_list;
	string_list=first_line.split(" ");
	if(string_list.size()<3)
		return false;
	if(string_list[0].find("HTTP")==string_list[0].npos)
		return false;
	response->protocol=string_list[0];
	response->code=string_list[1];
	return true;
}